

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

uint ncnn::get_elf_hwcap(uint type)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  bool bVar4;
  anon_struct_8_2_05f151bc entry;
  undefined8 local_28;
  
  local_28 = in_RAX;
  __stream = fopen("/proc/self/auxv","rb");
  if (__stream == (FILE *)0x0) {
    get_elf_hwcap();
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      sVar2 = fread(&local_28,8,1,__stream);
      if ((int)sVar2 == 1) {
        if ((uint)local_28 == 0 && local_28._4_4_ == 0) goto LAB_0016b780;
        bVar4 = (uint)local_28 != type;
        if (!bVar4) {
          uVar3 = local_28._4_4_;
        }
      }
      else {
LAB_0016b780:
        bVar4 = false;
      }
    } while (bVar4);
    fclose(__stream);
  }
  return uVar3;
}

Assistant:

static unsigned int get_elf_hwcap(unsigned int type)
{
#if defined __ANDROID__
    unsigned int hwcap = get_elf_hwcap_from_getauxval(type);
    if (hwcap)
        return hwcap;
#endif

    return get_elf_hwcap_from_proc_self_auxv(type);
}